

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O1

int64_t lookup_gid(void *private_data,char *gname,int64_t gid)

{
  undefined8 *puVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  char *__ptr;
  size_t bufsize;
  size_t __buflen;
  group *result;
  group grent;
  char _buffer [128];
  group *local_e8;
  ulong local_e0;
  group local_d8;
  char local_b8 [136];
  
  if ((gname != (char *)0x0) && (cVar4 = *gname, cVar4 != '\0')) {
    pcVar3 = gname + 1;
    uVar7 = 0;
    do {
      uVar6 = uVar7 * 0x10 + (int)cVar4;
      uVar7 = uVar6 & 0xfffffff ^ (uVar6 & 0xf0000000) >> 0x18;
      if ((uVar6 & 0xf0000000) == 0) {
        uVar7 = uVar6;
      }
      cVar4 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar4 != '\0');
    uVar5 = (ulong)(((int)((ulong)(long)(int)uVar7 / 0x7f) * -0x7f + uVar7) * 0x10);
    puVar1 = (undefined8 *)((long)private_data + uVar5);
    pcVar3 = *(char **)((long)private_data + uVar5);
    if (pcVar3 != (char *)0x0) {
      if ((*(uint *)(puVar1 + 1) == uVar7) && (iVar2 = strcmp(gname,pcVar3), iVar2 == 0)) {
        return (ulong)*(uint *)((long)puVar1 + 0xc);
      }
      if (pcVar3 != (char *)0x0) {
        free(pcVar3);
      }
    }
    local_e0 = gid;
    pcVar3 = strdup(gname);
    *puVar1 = pcVar3;
    *(uint *)(puVar1 + 1) = uVar7;
    pcVar3 = local_b8;
    __buflen = 0x80;
    __ptr = (char *)0x0;
    do {
      local_e8 = &local_d8;
      iVar2 = getgrnam_r(gname,&local_d8,pcVar3,__buflen,&local_e8);
      if (iVar2 != 0x22) goto LAB_00141c8b;
      __buflen = __buflen * 2;
      free(__ptr);
      pcVar3 = (char *)malloc(__buflen);
      __ptr = pcVar3;
    } while (pcVar3 != (char *)0x0);
    __ptr = (char *)0x0;
LAB_00141c8b:
    gid = local_e0;
    if (local_e8 != (group *)0x0) {
      gid = (int64_t)local_e8->gr_gid;
    }
    free(__ptr);
    *(int *)((long)puVar1 + 0xc) = (int)gid;
  }
  return gid;
}

Assistant:

static int64_t
lookup_gid(void *private_data, const char *gname, int64_t gid)
{
	int h;
	struct bucket *b;
	struct bucket *gcache = (struct bucket *)private_data;

	/* If no gname, just use the gid provided. */
	if (gname == NULL || *gname == '\0')
		return (gid);

	/* Try to find gname in the cache. */
	h = hash(gname);
	b = &gcache[h % cache_size ];
	if (b->name != NULL && b->hash == h && strcmp(gname, b->name) == 0)
		return ((gid_t)b->id);

	/* Free the cache slot for a new entry. */
	if (b->name != NULL)
		free(b->name);
	b->name = strdup(gname);
	/* Note: If strdup fails, that's okay; we just won't cache. */
	b->hash = h;
#if HAVE_GRP_H
#  if HAVE_GETGRNAM_R
	{
		char _buffer[128];
		size_t bufsize = 128;
		char *buffer = _buffer;
		char *allocated = NULL;
		struct group	grent, *result;
		int r;

		for (;;) {
			result = &grent; /* Old getgrnam_r ignores last arg. */
			r = getgrnam_r(gname, &grent, buffer, bufsize, &result);
			if (r == 0)
				break;
			if (r != ERANGE)
				break;
			bufsize *= 2;
			free(allocated);
			allocated = malloc(bufsize);
			if (allocated == NULL)
				break;
			buffer = allocated;
		}
		if (result != NULL)
			gid = result->gr_gid;
		free(allocated);
	}
#  else /* HAVE_GETGRNAM_R */
	{
		struct group *result;

		result = getgrnam(gname);
		if (result != NULL)
			gid = result->gr_gid;
	}
#  endif /* HAVE_GETGRNAM_R */
#elif defined(_WIN32) && !defined(__CYGWIN__)
	/* TODO: do a gname->gid lookup for Windows. */
#else
	#error No way to perform gid lookups on this platform
#endif
	b->id = (gid_t)gid;

	return (gid);
}